

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char **ppcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  LogLevel LVar29;
  size_t sVar30;
  char *pcVar31;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  bool toPly;
  bool format;
  optional<std::vector<float,_std::allocator<float>_>_> c;
  string pixelBounds;
  string pixel;
  string renderCoordSys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string logLevel;
  string cropWindow;
  bool local_1311;
  bool local_12d9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12c8;
  bool local_12b9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12b0;
  char **local_12a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_12a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1280;
  string local_1278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1258;
  char local_1249;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1240;
  string local_1238;
  string local_1218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_11f8;
  string local_11f0;
  string local_11d0;
  string local_11b0;
  string local_1190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1170;
  string local_1168;
  string local_1148;
  string local_1128;
  string local_1108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10e8;
  string local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1020;
  string local_1018;
  string local_ff8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fd8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fb8;
  string local_f98;
  string local_f78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  PBRTOptions local_f38;
  string local_e48;
  _Any_data local_e28;
  code *local_e18;
  code *local_e10;
  _Any_data local_e08;
  code *local_df8;
  code *local_df0;
  _Any_data local_de8;
  code *local_dd8;
  code *local_dd0;
  _Any_data local_dc8;
  code *local_db8;
  code *local_db0;
  _Any_data local_da8;
  code *local_d98;
  code *local_d90;
  _Any_data local_d88;
  code *local_d78;
  code *local_d70;
  _Any_data local_d68;
  code *local_d58;
  code *local_d50;
  _Any_data local_d48;
  code *local_d38;
  code *local_d30;
  _Any_data local_d28;
  code *local_d18;
  code *local_d10;
  _Any_data local_d08;
  code *local_cf8;
  code *local_cf0;
  _Any_data local_ce8;
  code *local_cd8;
  code *local_cd0;
  _Any_data local_cc8;
  code *local_cb8;
  code *local_cb0;
  _Any_data local_ca8;
  code *local_c98;
  code *local_c90;
  _Any_data local_c88;
  code *local_c78;
  code *local_c70;
  _Any_data local_c68;
  code *local_c58;
  code *local_c50;
  _Any_data local_c48;
  code *local_c38;
  code *local_c30;
  _Any_data local_c28;
  code *local_c18;
  code *local_c10;
  _Any_data local_c08;
  code *local_bf8;
  code *local_bf0;
  _Any_data local_be8;
  code *local_bd8;
  code *local_bd0;
  _Any_data local_bc8;
  code *local_bb8;
  code *local_bb0;
  _Any_data local_ba8;
  code *local_b98;
  code *local_b90;
  _Any_data local_b88;
  code *local_b78;
  code *local_b70;
  undefined1 local_b60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_b30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b28;
  undefined1 local_b20 [64];
  undefined1 local_ae0 [48];
  undefined1 local_ab0 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a90;
  
  local_fb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_f38.imageFile._M_dataplus._M_p = (pointer)((long)&local_f38 + 0x38);
  local_f38.super_BasicOptions.renderingSpace = CameraWorld;
  local_f38.logLevel = Error;
  local_f38.pixelSamples.set = false;
  local_f38.gpuDevice.set = false;
  local_f38.imageFile._M_string_length = 0;
  local_f38.imageFile.field_2._M_local_buf[0] = '\0';
  local_f38.mseReferenceImage._M_dataplus._M_p = (pointer)((long)&local_f38 + 0x58);
  local_f38.mseReferenceImage._M_string_length = 0;
  local_f38.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_f38.mseReferenceOutput._M_dataplus._M_p = (pointer)((long)&local_f38 + 0x78);
  local_f38.mseReferenceOutput._M_string_length = 0;
  local_f38.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_f38.debugStart._M_dataplus._M_p = (pointer)((long)&local_f38 + 0x98);
  local_f38.debugStart._M_string_length = 0;
  local_f38.debugStart.field_2._M_local_buf[0] = '\0';
  local_f38.displayServer._M_dataplus._M_p = (pointer)((long)&local_f38 + 0xb8);
  local_f38.displayServer._M_string_length = 0;
  local_f38.displayServer.field_2._M_local_buf[0] = '\0';
  local_f38.cropWindow.set = false;
  local_f38.pixelBounds.set = false;
  local_fb8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f58._M_dataplus._M_p = (pointer)&local_f58.field_2;
  local_12a8 = argv;
  local_f38.super_BasicOptions._0_16_ =
       local_fb8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._0_16_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f58,"error","");
  local_fd8._M_dataplus._M_p = (pointer)&local_fd8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fd8,"cameraworld","");
  local_12b9 = false;
  local_12d9 = false;
  ppcVar1 = local_12a8 + 1;
  pcVar31 = local_12a8[1];
  local_12a8 = ppcVar1;
  if (pcVar31 != (char *)0x0) {
    local_12d8 = &local_1238.field_2;
    local_12d0 = &local_1218.field_2;
    local_12c8 = &local_11f0.field_2;
    local_12b8 = &local_11d0.field_2;
    local_12b0 = &local_11b0.field_2;
    local_12a0 = &local_1190.field_2;
    local_1298 = &local_1168.field_2;
    local_1290 = &local_1148.field_2;
    local_1288 = &local_1128.field_2;
    local_1280 = &local_1108.field_2;
    local_1258 = &local_10e0.field_2;
    local_1248 = &local_10a0.field_2;
    local_1240 = &local_1080.field_2;
    local_11f8 = &local_1060.field_2;
    local_1170 = &local_1018.field_2;
    local_10e8 = &local_ff8.field_2;
    local_1020 = &local_f98.field_2;
    do {
      if (*pcVar31 == '-') {
        local_b60._8_8_ = 0;
        local_b60[0x10] = '\0';
        local_10c0._M_string_length = 0;
        local_10c0.field_2._M_local_buf[0] = '\0';
        local_1040._M_string_length = 0;
        local_1040.field_2._M_local_buf[0] = '\0';
        local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
        local_10c0._M_dataplus._M_p = (pointer)&local_10c0.field_2;
        local_1040._M_dataplus._M_p = (pointer)&local_1040.field_2;
        local_b60._0_8_ = local_b60 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"cropwindow","");
        local_b88._M_unused._M_object = (void *)0x0;
        local_b88._8_8_ = 0;
        local_b70 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_invoke;
        local_b78 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_manager;
        bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_12a8,&local_1278,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b60,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_b88);
        if (local_b78 != (code *)0x0) {
          (*local_b78)(&local_b88,&local_b88,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
          operator_delete(local_1278._M_dataplus._M_p,
                          CONCAT71(local_1278.field_2._M_allocated_capacity._1_7_,
                                   local_1278.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar27) {
          local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"pixel","");
          local_ba8 = (_Any_data)(ZEXT816(0) << 0x40);
          local_b90 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_invoke;
          local_b98 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_manager;
          bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_12a8,&local_1278,&local_1040,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_ba8);
          if (local_b98 != (code *)0x0) {
            (*local_b98)(&local_ba8,&local_ba8,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
            operator_delete(local_1278._M_dataplus._M_p,
                            CONCAT71(local_1278.field_2._M_allocated_capacity._1_7_,
                                     local_1278.field_2._M_local_buf[0]) + 1);
          }
          if (bVar27) {
            str_00._M_str = local_1040._M_dataplus._M_p;
            str_00._M_len = local_1040._M_string_length;
            pbrt::SplitStringToInts
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_1278,str_00,',');
            if ((local_1278.field_2._M_local_buf[8] == '\x01') &&
               (local_1278._M_string_length - (long)local_1278._M_dataplus._M_p == 8)) {
              local_f38.pixelBounds.optionalValue._0_8_ = *(undefined8 *)local_1278._M_dataplus._M_p
              ;
              local_f38.pixelBounds.optionalValue._8_8_ =
                   CONCAT44(*(uint *)(local_1278._M_dataplus._M_p + 4) + 1,
                            *(uint *)local_1278._M_dataplus._M_p + 1);
LAB_001fbe1f:
              local_f38.pixelBounds.set = true;
              goto LAB_001fbe27;
            }
            local_e48._M_dataplus._M_p = (pointer)&local_e48.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e48,"Didn\'t find two values after --pixel","");
LAB_001fd775:
            usage(&local_e48);
          }
          else {
            local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"pixelbounds","");
            local_bc8 = (_Any_data)(ZEXT816(0) << 0x40);
            local_bb0 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_invoke;
            local_bb8 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_manager;
            bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                               (&local_12a8,&local_1278,&local_10c0,
                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                 *)&local_bc8);
            if (local_bb8 != (code *)0x0) {
              (*local_bb8)(&local_bc8,&local_bc8,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
              operator_delete(local_1278._M_dataplus._M_p,
                              CONCAT71(local_1278.field_2._M_allocated_capacity._1_7_,
                                       local_1278.field_2._M_local_buf[0]) + 1);
            }
            if (bVar27) {
              str_01._M_str = local_10c0._M_dataplus._M_p;
              str_01._M_len = local_10c0._M_string_length;
              pbrt::SplitStringToInts
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_1278,str_01,','
                        );
              if ((local_1278.field_2._M_local_buf[8] == '\x01') &&
                 (local_1278._M_string_length - (long)local_1278._M_dataplus._M_p == 0x10)) {
                uVar2 = *(uint *)(local_1278._M_dataplus._M_p + 8);
                uVar3 = *(uint *)local_1278._M_dataplus._M_p;
                uVar4 = *(uint *)(local_1278._M_dataplus._M_p + 4);
                uVar5 = *(uint *)(local_1278._M_dataplus._M_p + 0xc);
                uVar9 = uVar3;
                if ((int)uVar4 < (int)uVar3) {
                  uVar9 = uVar4;
                }
                uVar10 = uVar2;
                if ((int)uVar5 < (int)uVar2) {
                  uVar10 = uVar5;
                }
                if ((int)uVar4 < (int)uVar3) {
                  uVar4 = uVar3;
                }
                if ((int)uVar5 < (int)uVar2) {
                  uVar5 = uVar2;
                }
                local_f38.pixelBounds.optionalValue._0_8_ = CONCAT44(uVar10,uVar9);
                local_f38.pixelBounds.optionalValue._8_8_ = CONCAT44(uVar5,uVar4);
                goto LAB_001fbe1f;
              }
              local_e48._M_dataplus._M_p = (pointer)&local_e48.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e48,"Didn\'t find four integer values after --pixelbounds"
                         ,"");
              goto LAB_001fd775;
            }
            local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1278,"debugstart","");
            local_be8 = (_Any_data)(ZEXT816(0) << 0x40);
            local_bd0 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_invoke;
            local_bd8 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_manager;
            local_1249 = pbrt::ParseArg<std::__cxx11::string*>
                                   (&local_12a8,&local_1278,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&local_f38 + 0x88),
                                    (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_be8);
            if ((bool)local_1249) {
LAB_001fbf52:
              bVar26 = false;
              bVar25 = false;
              bVar24 = false;
              bVar23 = false;
              bVar22 = false;
              bVar21 = false;
              bVar20 = false;
              bVar19 = false;
              bVar18 = false;
              bVar17 = false;
              bVar16 = false;
              bVar15 = false;
              bVar14 = false;
              bVar27 = false;
LAB_001fc14c:
              bVar13 = false;
LAB_001fc14e:
              local_1311 = true;
              bVar12 = false;
              bVar11 = false;
            }
            else {
              local_1238._M_dataplus._M_p = (pointer)&local_1238.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1238,"disable-pixel-jitter","");
              local_c08 = (_Any_data)(ZEXT816(0) << 0x40);
              local_bf0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_bf8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_1238,(bool *)((long)&local_f38 + 0xc),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_c08);
              if (bVar27) goto LAB_001fbf52;
              local_1218._M_dataplus._M_p = (pointer)&local_1218.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1218,"disable-wavelength-jitter","");
              local_c28 = (_Any_data)(ZEXT816(0) << 0x40);
              local_c10 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_c18 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_1218,(bool *)((long)&local_f38 + 0xd),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_c28);
              if (bVar27) {
                bVar25 = false;
LAB_001fc0f1:
                bVar24 = false;
LAB_001fc0f9:
                bVar23 = false;
LAB_001fc101:
                bVar22 = false;
LAB_001fc109:
                bVar21 = false;
LAB_001fc111:
                bVar20 = false;
LAB_001fc119:
                bVar19 = false;
LAB_001fc121:
                bVar18 = false;
LAB_001fc129:
                bVar17 = false;
LAB_001fc131:
                bVar16 = false;
LAB_001fc139:
                bVar15 = false;
LAB_001fc141:
                bVar14 = false;
LAB_001fc144:
                bVar27 = false;
LAB_001fc147:
                bVar26 = true;
                goto LAB_001fc14c;
              }
              local_11f0._M_dataplus._M_p = (pointer)&local_11f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_11f0,"display-server","");
              local_c48 = (_Any_data)(ZEXT816(0) << 0x40);
              local_c30 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_c38 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_11f0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_f38 + 0xa8),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_c48);
              if (bVar27) {
                bVar25 = true;
                goto LAB_001fc0f1;
              }
              local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_11d0,"force-diffuse","");
              local_c68 = (_Any_data)(ZEXT816(0) << 0x40);
              local_c50 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_c58 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_11d0,(bool *)((long)&local_f38 + 0xe),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_c68);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                goto LAB_001fc0f9;
              }
              local_11b0._M_dataplus._M_p = (pointer)&local_11b0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_11b0,"format","");
              local_c88 = (_Any_data)(ZEXT816(0) << 0x40);
              local_c70 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_c78 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_11b0,&local_12b9,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_c88);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                goto LAB_001fc101;
              }
              local_1190._M_dataplus._M_p = (pointer)&local_1190.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1190,"log-level","");
              local_ca8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_c90 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_c98 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_1190,&local_f58,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_ca8);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                goto LAB_001fc109;
              }
              local_1168._M_dataplus._M_p = (pointer)&local_1168.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1168,"mse-reference-image","");
              local_cc8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_cb0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_cb8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_1168,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_f38 + 0x48),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_cc8);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                goto LAB_001fc111;
              }
              local_1148._M_dataplus._M_p = (pointer)&local_1148.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1148,"mse-reference-out","");
              local_ce8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_cd0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_cd8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_1148,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_f38 + 0x68),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_ce8);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                goto LAB_001fc119;
              }
              local_1128._M_dataplus._M_p = (pointer)&local_1128.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1128,"nthreads","");
              local_d08 = (_Any_data)(ZEXT816(0) << 0x40);
              local_cf0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_cf8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<int*>
                                 (&local_12a8,&local_1128,(int *)&local_f38,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_d08);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                goto LAB_001fc121;
              }
              local_1108._M_dataplus._M_p = (pointer)&local_1108.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1108,"outfile","");
              local_d28 = (_Any_data)(ZEXT816(0) << 0x40);
              local_d10 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_d18 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_1108,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_f38 + 0x28),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_d28);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                goto LAB_001fc129;
              }
              local_10e0._M_dataplus._M_p = (pointer)&local_10e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_10e0,"pixelstats","")
              ;
              local_d48 = (_Any_data)(ZEXT816(0) << 0x40);
              local_d30 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_d38 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_10e0,(bool *)((long)&local_f38 + 10),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_d48);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                goto LAB_001fc131;
              }
              local_10a0._M_dataplus._M_p = (pointer)&local_10a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_10a0,"quick","");
              local_d68 = (_Any_data)(ZEXT816(0) << 0x40);
              local_d50 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_d58 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_10a0,(bool *)((long)&local_f38 + 8),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_d68);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                goto LAB_001fc139;
              }
              local_1080._M_dataplus._M_p = (pointer)&local_1080.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1080,"quiet","");
              local_d88 = (_Any_data)(ZEXT816(0) << 0x40);
              local_d70 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_d78 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_1080,(bool *)((long)&local_f38 + 9),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_d88);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                goto LAB_001fc141;
              }
              local_1060._M_dataplus._M_p = (pointer)&local_1060.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1060,"render-coord-sys","");
              local_da8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_d90 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_d98 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_12a8,&local_1060,&local_fd8,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_da8);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                bVar14 = true;
                goto LAB_001fc144;
              }
              local_1018._M_dataplus._M_p = (pointer)&local_1018.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1018,"seed","");
              local_dc8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_db0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_db8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<int*>
                                 (&local_12a8,&local_1018,(int *)((long)&local_f38 + 4),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_dc8);
              if (bVar27) {
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                bVar14 = true;
                bVar27 = true;
                goto LAB_001fc147;
              }
              local_ff8._M_dataplus._M_p = (pointer)&local_ff8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_ff8,"spp","");
              local_de8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_dd0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_dd8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<pstd::optional<int>*>
                                 (&local_12a8,&local_ff8,(optional<int> *)((long)&local_f38 + 0x18),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_de8);
              if (bVar27) {
                bVar26 = true;
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                bVar14 = true;
                bVar27 = true;
                bVar13 = true;
                goto LAB_001fc14e;
              }
              local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f98,"toply","");
              local_e08 = (_Any_data)(ZEXT816(0) << 0x40);
              local_df0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_df8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar27 = pbrt::ParseArg<bool*>
                                 (&local_12a8,&local_f98,&local_12d9,
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_e08);
              if (bVar27) {
                bVar26 = true;
                bVar11 = false;
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                bVar14 = true;
                bVar27 = true;
                local_1311 = true;
                bVar13 = true;
                bVar12 = true;
              }
              else {
                local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f78,"upgrade","");
                local_e28 = (_Any_data)(ZEXT816(0) << 0x40);
                local_e10 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_invoke;
                local_e18 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_manager;
                local_1311 = pbrt::ParseArg<bool*>
                                       (&local_12a8,&local_f78,(bool *)((long)&local_f38 + 0xb),
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)&local_e28);
                bVar26 = true;
                bVar25 = true;
                bVar24 = true;
                bVar23 = true;
                bVar22 = true;
                bVar21 = true;
                bVar20 = true;
                bVar19 = true;
                bVar18 = true;
                bVar17 = true;
                bVar16 = true;
                bVar15 = true;
                bVar14 = true;
                bVar27 = true;
                bVar13 = true;
                bVar12 = true;
                bVar11 = true;
              }
            }
            if (bVar11) {
              if (local_e18 != (code *)0x0) {
                (*local_e18)(&local_e28,&local_e28,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
                operator_delete(local_f78._M_dataplus._M_p,
                                local_f78.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar12) {
              if (local_df8 != (code *)0x0) {
                (*local_df8)(&local_e08,&local_e08,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
                operator_delete(local_f98._M_dataplus._M_p,
                                local_f98.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar13) {
              if (local_dd8 != (code *)0x0) {
                (*local_dd8)(&local_de8,&local_de8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
                operator_delete(local_ff8._M_dataplus._M_p,
                                local_ff8.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar27) {
              if (local_db8 != (code *)0x0) {
                (*local_db8)(&local_dc8,&local_dc8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
                operator_delete(local_1018._M_dataplus._M_p,
                                local_1018.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar14) {
              if (local_d98 != (code *)0x0) {
                (*local_d98)(&local_da8,&local_da8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1060._M_dataplus._M_p != &local_1060.field_2) {
                operator_delete(local_1060._M_dataplus._M_p,
                                local_1060.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar15) {
              if (local_d78 != (code *)0x0) {
                (*local_d78)(&local_d88,&local_d88,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1080._M_dataplus._M_p != &local_1080.field_2) {
                operator_delete(local_1080._M_dataplus._M_p,
                                local_1080.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar16) {
              if (local_d58 != (code *)0x0) {
                (*local_d58)(&local_d68,&local_d68,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10a0._M_dataplus._M_p != &local_10a0.field_2) {
                operator_delete(local_10a0._M_dataplus._M_p,
                                local_10a0.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar17) {
              if (local_d38 != (code *)0x0) {
                (*local_d38)(&local_d48,&local_d48,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_10e0._M_dataplus._M_p != &local_10e0.field_2) {
                operator_delete(local_10e0._M_dataplus._M_p,
                                local_10e0.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar18) {
              if (local_d18 != (code *)0x0) {
                (*local_d18)(&local_d28,&local_d28,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1108._M_dataplus._M_p != &local_1108.field_2) {
                operator_delete(local_1108._M_dataplus._M_p,
                                local_1108.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar19) {
              if (local_cf8 != (code *)0x0) {
                (*local_cf8)(&local_d08,&local_d08,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1128._M_dataplus._M_p != &local_1128.field_2) {
                operator_delete(local_1128._M_dataplus._M_p,
                                local_1128.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar20) {
              if (local_cd8 != (code *)0x0) {
                (*local_cd8)(&local_ce8,&local_ce8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1148._M_dataplus._M_p != &local_1148.field_2) {
                operator_delete(local_1148._M_dataplus._M_p,
                                local_1148.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar21) {
              if (local_cb8 != (code *)0x0) {
                (*local_cb8)(&local_cc8,&local_cc8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1168._M_dataplus._M_p != &local_1168.field_2) {
                operator_delete(local_1168._M_dataplus._M_p,
                                local_1168.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar22) {
              if (local_c98 != (code *)0x0) {
                (*local_c98)(&local_ca8,&local_ca8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1190._M_dataplus._M_p != &local_1190.field_2) {
                operator_delete(local_1190._M_dataplus._M_p,
                                local_1190.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar23) {
              if (local_c78 != (code *)0x0) {
                (*local_c78)(&local_c88,&local_c88,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11b0._M_dataplus._M_p != &local_11b0.field_2) {
                operator_delete(local_11b0._M_dataplus._M_p,
                                local_11b0.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar24) {
              if (local_c58 != (code *)0x0) {
                (*local_c58)(&local_c68,&local_c68,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
                operator_delete(local_11d0._M_dataplus._M_p,
                                local_11d0.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar25) {
              if (local_c38 != (code *)0x0) {
                (*local_c38)(&local_c48,&local_c48,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11f0._M_dataplus._M_p != &local_11f0.field_2) {
                operator_delete(local_11f0._M_dataplus._M_p,
                                local_11f0.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar26) {
              if (local_c18 != (code *)0x0) {
                (*local_c18)(&local_c28,&local_c28,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1218._M_dataplus._M_p != &local_1218.field_2) {
                operator_delete(local_1218._M_dataplus._M_p,
                                local_1218.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_1249 == '\0') {
              if (local_bf8 != (code *)0x0) {
                (*local_bf8)(&local_c08,&local_c08,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1238._M_dataplus._M_p != &local_1238.field_2) {
                operator_delete(local_1238._M_dataplus._M_p,
                                local_1238.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_bd8 != (code *)0x0) {
              (*local_bd8)(&local_be8,&local_be8,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
              operator_delete(local_1278._M_dataplus._M_p,
                              CONCAT71(local_1278.field_2._M_allocated_capacity._1_7_,
                                       local_1278.field_2._M_local_buf[0]) + 1);
            }
            if (local_1311 != false) goto LAB_001fc6f7;
          }
          ppcVar1 = local_12a8;
          pcVar31 = *local_12a8;
          iVar28 = strcmp(pcVar31,"--help");
          if (((iVar28 != 0) && (iVar28 = strcmp(pcVar31,"-help"), iVar28 != 0)) &&
             (iVar28 = strcmp(pcVar31,"-h"), iVar28 != 0)) {
            local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
            local_1278._M_string_length = 0;
            local_1278.field_2._M_local_buf[0] = '\0';
            pbrt::detail::stringPrintfRecursive<char*&>
                      (&local_1278,"argument \"%s\" unknown",ppcVar1);
            usage(&local_1278);
            goto LAB_001fd837;
          }
          local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
          local_1278._M_string_length = 0;
          local_1278.field_2._M_local_buf[0] = '\0';
          usage(&local_1278);
          goto LAB_001fd7e7;
        }
        str._M_str = (char *)local_b60._0_8_;
        str._M_len = local_b60._8_8_;
        pbrt::SplitStringToFloats
                  ((optional<std::vector<float,_std::allocator<float>_>_> *)&local_1278,str,',');
        if ((local_1278.field_2._M_local_buf[8] != '\x01') ||
           (local_1278._M_string_length - (long)local_1278._M_dataplus._M_p != 0x10)) {
          local_e48._M_dataplus._M_p = (pointer)&local_e48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e48,"Didn\'t find four values after --cropwindow","");
          goto LAB_001fd775;
        }
        auVar7 = vminss_avx(ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 4)),
                            ZEXT416(*(uint *)local_1278._M_dataplus._M_p));
        auVar8 = vminss_avx(ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 0xc)),
                            ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 8)));
        auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
        auVar8 = vmaxss_avx(ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 4)),
                            ZEXT416(*(uint *)local_1278._M_dataplus._M_p));
        auVar6 = vmaxss_avx(ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 0xc)),
                            ZEXT416(*(uint *)(local_1278._M_dataplus._M_p + 8)));
        auVar8 = vinsertps_avx(auVar8,auVar6,0x10);
        local_f38.cropWindow.optionalValue =
             (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
             vmovlhps_avx(auVar7,auVar8);
        local_f38.cropWindow.set = true;
LAB_001fbe27:
        if (local_1278.field_2._M_local_buf[8] == '\x01') {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1278._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_1278._M_dataplus._M_p,
                            CONCAT71(local_1278.field_2._M_allocated_capacity._1_7_,
                                     local_1278.field_2._M_local_buf[0]) -
                            (long)local_1278._M_dataplus._M_p);
          }
          local_1278.field_2._M_local_buf[8] = '\0';
        }
LAB_001fc6f7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1040._M_dataplus._M_p != &local_1040.field_2) {
          operator_delete(local_1040._M_dataplus._M_p,
                          CONCAT71(local_1040.field_2._M_allocated_capacity._1_7_,
                                   local_1040.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_10c0._M_dataplus._M_p != &local_10c0.field_2) {
          operator_delete(local_10c0._M_dataplus._M_p,
                          CONCAT71(local_10c0.field_2._M_allocated_capacity._1_7_,
                                   local_10c0.field_2._M_local_buf[0]) + 1);
        }
        if ((undefined1 *)local_b60._0_8_ != local_b60 + 0x10) {
          operator_delete((void *)local_b60._0_8_,
                          CONCAT62(local_b60._18_6_,CONCAT11(local_b60[0x11],local_b60[0x10])) + 1);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b60,*local_12a8,(allocator<char> *)&local_10c0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_fb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60);
        if ((undefined1 *)local_b60._0_8_ != local_b60 + 0x10) {
          operator_delete((void *)local_b60._0_8_,
                          CONCAT62(local_b60._18_6_,CONCAT11(local_b60[0x11],local_b60[0x10])) + 1);
        }
        local_12a8 = local_12a8 + 1;
      }
      pcVar31 = *local_12a8;
    } while (pcVar31 != (char *)0x0);
  }
  if (((local_f38.super_BasicOptions.quiet == false) && (local_12b9 == false)) &&
     ((local_12d9 == false && (local_f38.super_BasicOptions.upgrade == false)))) {
    printf("pbrt version 4 (built %s at %s)\n","May  2 2025","20:06:47");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  iVar28 = std::__cxx11::string::compare((char *)&local_fd8);
  if (iVar28 == 0) {
    sVar30 = 0;
  }
  else {
    iVar28 = std::__cxx11::string::compare((char *)&local_fd8);
    if (iVar28 == 0) {
      sVar30 = 1;
    }
    else {
      iVar28 = std::__cxx11::string::compare((char *)&local_fd8);
      sVar30 = 2;
      if (iVar28 != 0) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&local_fd8);
      }
    }
  }
  local_f38.super_BasicOptions.renderingSpace = (RenderingCoordinateSystem)sVar30;
  if ((local_f38.mseReferenceImage._M_string_length == 0) ||
     (local_f38.mseReferenceOutput._M_string_length != 0)) {
    if ((local_f38.mseReferenceImage._M_string_length != 0) ||
       (local_f38.mseReferenceOutput._M_string_length == 0)) {
      LVar29 = pbrt::LogLevelFromString(&local_f58);
      local_f38.logLevel = LVar29;
      pbrt::InitPBRT(&local_f38);
      if (((local_12b9 == false) && (local_12d9 == false)) &&
         (local_f38.super_BasicOptions.upgrade != true)) {
        pbrt::ParsedScene::ParsedScene((ParsedScene *)local_b60);
        filenames_01.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_fb8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_fb8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        filenames_01.n = sVar30;
        pbrt::ParseFiles((pbrt *)local_b60,
                         (SceneRepresentation *)
                         local_fb8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_01);
        if (local_f38.super_BasicOptions.useGPU == true) {
LAB_001fd837:
          pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
        }
        pbrt::CPURender((ParsedScene *)local_b60);
        if (pbrt::LOGGING_LogLevel < 1) {
          local_1040._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
          local_10c0._M_string_length = 0;
          local_10c0.field_2._M_local_buf[0] = '\0';
          local_10c0._M_dataplus._M_p = (pointer)&local_10c0.field_2;
          pbrt::detail::stringPrintfRecursive<unsigned_long>
                    (&local_10c0,"Memory used after post-render cleanup: %s",
                     (unsigned_long *)&local_1040);
          pbrt::Log(Verbose,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp"
                    ,0xf3,local_10c0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_10c0._M_dataplus._M_p != &local_10c0.field_2) {
            operator_delete(local_10c0._M_dataplus._M_p,
                            CONCAT71(local_10c0.field_2._M_allocated_capacity._1_7_,
                                     local_10c0.field_2._M_local_buf[0]) + 1);
          }
        }
        pbrt::CleanupPBRT();
        pbrt::ParsedScene::~ParsedScene((ParsedScene *)local_b60);
      }
      else {
        filenames_00.n._1_7_ = (undefined7)(sVar30 >> 8);
        filenames_00.n._0_1_ = local_f38.super_BasicOptions.upgrade;
        local_b30.memoryResource = (memory_resource *)&local_b40;
        local_b60._0_8_ = &PTR_Scale_0300a388;
        local_b60._8_8_ = ((ulong)local_b60._8_8_ >> 8 & 0xffffff) << 8;
        local_b60[0x10] = local_12d9;
        local_b60[0x11] = local_f38.super_BasicOptions.upgrade;
        local_b40._M_allocated_capacity._0_4_ = 0;
        local_b40._8_8_ = 0;
        local_b20._0_8_ = (ParsedParameter *)0x0;
        local_b20._32_8_ = local_b20 + 0x10;
        local_b20._16_4_ = _S_red;
        local_b20._24_8_ = (ParsedParameter *)0x0;
        local_b20._48_8_ = (ParsedParameter *)0x0;
        local_ae0._16_8_ = local_ae0;
        local_ae0._0_4_ = _S_red;
        local_ae0._8_8_ = (_Base_ptr)0x0;
        local_ae0._32_8_ = (char *)0x0;
        local_ab0._16_8_ = local_ab0;
        local_ab0._0_4_ = _S_red;
        local_ab0._8_8_ = (_Base_ptr)0x0;
        local_a90.memoryResource = (memory_resource *)0x0;
        filenames_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_fb8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_fb8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        local_b28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b30.memoryResource;
        local_b20._40_8_ = local_b20._32_8_;
        local_ae0._24_8_ = local_ae0._16_8_;
        local_ab0._24_8_ = local_ab0._16_8_;
        pbrt::ParseFiles((pbrt *)local_b60,
                         (SceneRepresentation *)
                         local_fb8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_00);
        pbrt::FormattingScene::~FormattingScene((FormattingScene *)local_b60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fd8._M_dataplus._M_p != &local_fd8.field_2) {
        operator_delete(local_fd8._M_dataplus._M_p,local_fd8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
        operator_delete(local_f58._M_dataplus._M_p,local_f58.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_fb8);
      if (local_f38.pixelBounds.set == true) {
        local_f38.pixelBounds.set = false;
      }
      if (local_f38.cropWindow.set == true) {
        local_f38.cropWindow.set = false;
      }
      if (local_f38.displayServer._M_dataplus._M_p != (pointer)((long)&local_f38 + 0xb8U)) {
        operator_delete(local_f38.displayServer._M_dataplus._M_p,
                        CONCAT71(local_f38.displayServer.field_2._M_allocated_capacity._1_7_,
                                 local_f38.displayServer.field_2._M_local_buf[0]) + 1);
      }
      if (local_f38.debugStart._M_dataplus._M_p != (pointer)((long)&local_f38 + 0x98U)) {
        operator_delete(local_f38.debugStart._M_dataplus._M_p,
                        CONCAT71(local_f38.debugStart.field_2._M_allocated_capacity._1_7_,
                                 local_f38.debugStart.field_2._M_local_buf[0]) + 1);
      }
      if (local_f38.mseReferenceOutput._M_dataplus._M_p != (pointer)((long)&local_f38 + 0x78U)) {
        operator_delete(local_f38.mseReferenceOutput._M_dataplus._M_p,
                        CONCAT71(local_f38.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                                 local_f38.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
      }
      if (local_f38.mseReferenceImage._M_dataplus._M_p != (pointer)((long)&local_f38 + 0x58U)) {
        operator_delete(local_f38.mseReferenceImage._M_dataplus._M_p,
                        CONCAT71(local_f38.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                                 local_f38.mseReferenceImage.field_2._M_local_buf[0]) + 1);
      }
      if (local_f38.imageFile._M_dataplus._M_p != (pointer)((long)&local_f38 + 0x38U)) {
        operator_delete(local_f38.imageFile._M_dataplus._M_p,
                        CONCAT71(local_f38.imageFile.field_2._M_allocated_capacity._1_7_,
                                 local_f38.imageFile.field_2._M_local_buf[0]) + 1);
      }
      return 0;
    }
    pcVar31 = "Must provide MSE reference image via --mse-reference-image";
  }
  else {
LAB_001fd7e7:
    pcVar31 = "Must provide MSE reference output filename via --mse-reference-out";
  }
  pbrt::ErrorExit<>(pcVar31);
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            pstd::optional<std::vector<Float>> c = SplitStringToFloats(cropWindow, ',');
            if (!c || c->size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow =
                Bounds2f(Point2f((*c)[0], (*c)[2]), Point2f((*c)[1], (*c)[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixel, ',');
            if (!p || p->size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[1]), Point2i((*p)[0] + 1, (*p)[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixelBounds, ',');
            if (!p || p->size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[2]), Point2i((*p)[1], (*p)[3]));
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifndef NDEBUG
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif  // !NDEBUG
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}